

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjIterLookupTable::CVmObjIterLookupTable(CVmObjIterLookupTable *this,vm_val_t *coll)

{
  CVmVarHeap *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  CVmObjIterLookupTable *in_RSI;
  vm_val_t *in_RDI;
  uint flags;
  undefined4 extraout_var;
  
  CVmObjIter::CVmObjIter(&in_RSI->super_CVmObjIter);
  *(undefined ***)in_RDI = &PTR_get_metaclass_reg_00446da8;
  pCVar1 = CVmMemory::get_var_heap(G_mem_X);
  aVar2._0_4_ = (*pCVar1->_vptr_CVmVarHeap[4])(pCVar1,9,in_RDI);
  aVar2._4_4_ = extraout_var;
  in_RDI->val = aVar2;
  vmb_put_dh((char *)in_RSI,in_RDI);
  flags = (uint)((ulong)in_RDI >> 0x20);
  set_flags(in_RSI,flags);
  set_entry_index(in_RSI,flags);
  return;
}

Assistant:

CVmObjIterLookupTable::CVmObjIterLookupTable(VMG_ const vm_val_t *coll)
{
    /* allocate space for our extension data */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(VMOBJITERLOOKUPTABLE_EXT_SIZE, this);

    /* save the collection value */
    vmb_put_dh(ext_, coll);

    /* clear the flags */
    set_flags(0);

    /* 
     *   set up at index zero - we're not at a valid entry until initialized
     *   with getNext 
     */
    set_entry_index(0);
}